

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlDumpEnumeration(xmlBufferPtr buf,xmlEnumerationPtr cur)

{
  xmlEnumerationPtr cur_local;
  xmlBufferPtr buf_local;
  
  if ((buf != (xmlBufferPtr)0x0) && (cur != (xmlEnumerationPtr)0x0)) {
    xmlBufferWriteCHAR(buf,cur->name);
    if (cur->next == (_xmlEnumeration *)0x0) {
      xmlBufferWriteChar(buf,")");
    }
    else {
      xmlBufferWriteChar(buf," | ");
      xmlDumpEnumeration(buf,cur->next);
    }
  }
  return;
}

Assistant:

static void
xmlDumpEnumeration(xmlBufferPtr buf, xmlEnumerationPtr cur) {
    if ((buf == NULL) || (cur == NULL))
        return;

    xmlBufferWriteCHAR(buf, cur->name);
    if (cur->next == NULL)
	xmlBufferWriteChar(buf, ")");
    else {
	xmlBufferWriteChar(buf, " | ");
	xmlDumpEnumeration(buf, cur->next);
    }
}